

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

bool cmLibDirsLinked(string *l,string *r)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  string local_58;
  string local_38;
  
  bVar1 = cmsys::SystemTools::FileIsSymlink(l);
  if (bVar1) {
LAB_00207ea0:
    cmsys::SystemTools::GetRealPath(&local_58,l,(string *)0x0);
    cmsys::SystemTools::GetRealPath(&local_38,r,(string *)0x0);
    if (local_58._M_string_length == local_38._M_string_length) {
      bVar1 = true;
      if (local_58._M_string_length == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp(local_58._M_dataplus._M_p,local_38._M_dataplus._M_p,local_58._M_string_length);
        bVar3 = iVar2 == 0;
      }
      goto LAB_00207eee;
    }
    bVar1 = true;
  }
  else {
    bVar1 = cmsys::SystemTools::FileIsSymlink(r);
    if (bVar1) goto LAB_00207ea0;
    bVar1 = false;
  }
  bVar3 = false;
LAB_00207eee:
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar3;
}

Assistant:

static bool cmLibDirsLinked(std::string const& l, std::string const& r)
{
  // Compare the real paths of the two directories.
  // Since our caller only changed the trailing component of each
  // directory, the real paths can be the same only if at least one of
  // the trailing components is a symlink.  Use this as an optimization
  // to avoid excessive realpath calls.
  return (cmSystemTools::FileIsSymlink(l) ||
          cmSystemTools::FileIsSymlink(r)) &&
    cmSystemTools::GetRealPath(l) == cmSystemTools::GetRealPath(r);
}